

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O2

char32_t __thiscall TextFile::readCharacter(TextFile *this)

{
  size_t pos;
  byte bVar1;
  uchar uVar2;
  bool bVar3;
  unsigned_short SjisCharacter;
  ushort uVar4;
  optional<char16_t> oVar5;
  char32_t cVar6;
  char32_t cVar7;
  int iVar8;
  char *fmt;
  string local_50;
  
  cVar7 = L'\0';
  switch(this->encoding) {
  case ASCII:
    bVar1 = bufGetChar(this);
    cVar7 = (char32_t)bVar1;
    this->contentPos = this->contentPos + 1;
    break;
  case UTF8:
    bVar1 = bufGetChar(this);
    cVar7 = (char32_t)bVar1;
    if ((bVar1 & 0xe0) == 0xc0) {
      cVar7 = bVar1 & 0x1f;
      iVar8 = 1;
    }
    else if ((bVar1 & 0xf0) == 0xe0) {
      cVar7 = bVar1 & 0xf;
      iVar8 = 2;
    }
    else {
      iVar8 = 0;
      if ((char)bVar1 < '\0') {
        tinyformat::format<>(&local_50,"One or more invalid UTF-8 characters in this file");
        std::__cxx11::string::operator=((string *)&this->errorText,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    while (bVar3 = iVar8 != 0, iVar8 = iVar8 + -1, bVar3) {
      bVar1 = bufGetChar(this);
      if ((bVar1 & 0xc0) != 0x80) {
        tinyformat::format<>(&local_50,"One or more invalid UTF-8 characters in this file");
        std::__cxx11::string::operator=((string *)&this->errorText,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      cVar7 = cVar7 << 6 | bVar1 & 0x3f;
    }
    break;
  case UTF16LE:
    uVar4 = bufGet16LE(this);
    goto LAB_001483c3;
  case UTF16BE:
    uVar4 = bufGet16BE(this);
LAB_001483c3:
    cVar7 = (char32_t)uVar4;
    break;
  case SJIS:
    bVar1 = bufGetChar(this);
    SjisCharacter = (unsigned_short)bVar1;
    if ((char)bVar1 < '\0') {
      uVar2 = bufGetChar(this);
      SjisCharacter = CONCAT11(bVar1,uVar2);
    }
    oVar5 = sjisToUnicode(SjisCharacter);
    if (((uint)oVar5.super__Optional_base<char16_t,_true,_true>._M_payload.
               super__Optional_payload_base<char16_t> >> 0x10 & 1) == 0) {
      fmt = "One or more invalid Shift-JIS characters in this file";
      goto LAB_0014843f;
    }
    cVar7 = (uint)oVar5.super__Optional_base<char16_t,_true,_true>._M_payload.
                  super__Optional_payload_base<char16_t> & 0xffff;
    break;
  case GUESS:
    fmt = "Cannot read from GUESS encoding";
LAB_0014843f:
    tinyformat::format<>(&local_50,fmt);
    std::__cxx11::string::operator=((string *)&this->errorText,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  default:
    goto switchD_0014835b_default;
  }
  if (((cVar7 == L'\r') && (cVar7 = L'\r', this->recursion == false)) &&
     (bVar3 = atEnd(this), !bVar3)) {
    this->recursion = true;
    pos = this->contentPos;
    cVar6 = readCharacter(this);
    this->recursion = false;
    if (cVar6 == L'\n') {
      cVar7 = L'\n';
    }
    else {
      seek(this,pos);
    }
  }
switchD_0014835b_default:
  return cVar7;
}

Assistant:

char32_t TextFile::readCharacter()
{
	char32_t value = 0;

	switch (encoding)
	{
	case UTF8:
		{
			value = bufGetChar();
			
			int extraBytes = 0;
			if ((value & 0xE0) == 0xC0)
			{
				extraBytes = 1;
				value &= 0x1F;
			} else if ((value & 0xF0) == 0xE0)
			{
				extraBytes = 2;
				value &= 0x0F;
			} else if (value > 0x7F)
			{
				errorText = tfm::format("One or more invalid UTF-8 characters in this file");
			}

			for (int i = 0; i < extraBytes; i++)
			{
				int b = bufGetChar();
				if ((b & 0xC0) != 0x80)
				{
					errorText = tfm::format("One or more invalid UTF-8 characters in this file");
				}

				value = (value << 6) | (b & 0x3F);
			}
		}
		break;
	case UTF16LE:
		value = bufGet16LE();
		break;
	case UTF16BE:
		value = bufGet16BE();
		break;
	case SJIS:
		{
			unsigned short sjis = bufGetChar();
			if (sjis >= 0x80)
				sjis = (sjis << 8) | bufGetChar();

			if (auto unicode = sjisToUnicode(sjis))
				value = *unicode;
			else
				errorText = tfm::format("One or more invalid Shift-JIS characters in this file");
		}
		break;
	case ASCII:
		value = bufGetChar();
		contentPos++;
		break;

	case GUESS:
		errorText = tfm::format("Cannot read from GUESS encoding");
		break;
	}

	// convert \r\n to \n
	if (value == L'\r' && !recursion && !atEnd())
	{
		recursion = true;
		long pos = tell();
		char32_t nextValue = readCharacter();
		recursion = false;

		if (nextValue == L'\n')
			return nextValue;
		seek(pos);
	}

	return value;
}